

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLogger::~SimpleLogger(SimpleLogger *this)

{
  stop(this);
  std::_Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::~_Vector_base
            (&(this->logs).
              super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>);
  std::ofstream::~ofstream(&this->fs);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SimpleLogger::~SimpleLogger() {
    stop();
}